

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

uint64_t folder_uncompressed_size(_7z_folder *f)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar3 = (uint)f->numOutStreams;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)(uint)f->numBindPairs;
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    do {
      uVar1 = uVar4 - 1;
      if (uVar5 == 0) {
LAB_00531183:
        return f->unPackSize[uVar1 & 0xffffffff];
      }
      lVar6 = 0;
      while (*(ulong *)((long)&f->bindPairs->outIndex + lVar6) != uVar1) {
        lVar6 = lVar6 + 0x10;
        if (uVar5 << 4 == lVar6) goto LAB_00531183;
      }
      bVar2 = 1 < (long)uVar4;
      uVar4 = uVar1;
    } while (bVar2);
  }
  return 0;
}

Assistant:

static uint64_t
folder_uncompressed_size(struct _7z_folder *f)
{
	int n = (int)f->numOutStreams;
	unsigned pairs = (unsigned)f->numBindPairs;

	while (--n >= 0) {
		unsigned i;
		for (i = 0; i < pairs; i++) {
			if (f->bindPairs[i].outIndex == (uint64_t)n)
				break;
		}
		if (i >= pairs)
			return (f->unPackSize[n]);
	}
	return (0);
}